

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O1

ChLoad<MyLoaderTriangular> * __thiscall
chrono::ChLoad<MyLoaderTriangular>::Clone(ChLoad<MyLoaderTriangular> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChLoad<MyLoaderTriangular> *this_00;
  
  this_00 = (ChLoad<MyLoaderTriangular> *)operator_new(0x68);
  chrono::ChObj::ChObj((ChObj *)this_00,(ChObj *)this);
  *(code **)this_00 = chrono::ChLoadCustom::LoadGetStateBlock_w;
  *(undefined8 *)&this_00->field_0x38 = *(undefined8 *)&this->field_0x38;
  *(undefined ***)this_00 = &PTR__ChLoad_00139118;
  (this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoader_00138bd8;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)
             &(this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.super_ChLoader.Q,
             (DenseStorage<double,__1,__1,_1,_0> *)
             &(this->loader).super_ChLoaderUdistributed.super_ChLoaderU.super_ChLoader.Q);
  (this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderU_00138b98;
  (this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
  super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
       super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
           super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
  super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderU_001391e8;
  return this_00;
}

Assistant:

virtual ChLoad* Clone() const override { return new ChLoad(*this); }